

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t bytes_produced_by_serialization;
  
  iVar1 = (*this->_vptr_MessageLite[0xc])();
  if (iVar1 <= size) {
    iVar2 = (*this->_vptr_MessageLite[0xe])(this,data);
    bytes_produced_by_serialization = CONCAT44(extraout_var,iVar2) - (long)data;
    if (bytes_produced_by_serialization != (long)iVar1) {
      iVar2 = (*this->_vptr_MessageLite[0xc])(this);
      anon_unknown_12::ByteSizeConsistencyError
                ((long)iVar1,CONCAT44(extraout_var_00,iVar2),bytes_produced_by_serialization,this);
    }
  }
  return iVar1 <= size;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  int byte_size = ByteSizeLong();
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  uint8* end = SerializeWithCachedSizesToArray(start);
  if (end - start != byte_size) {
    ByteSizeConsistencyError(byte_size, ByteSizeLong(), end - start, *this);
  }
  return true;
}